

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

bool obj_check(CHAR_DATA *ch,OBJ_DATA *obj)

{
  bool bVar1;
  CHAR_DATA *in_RSI;
  bool local_1;
  
  bVar1 = is_trusted(in_RSI,0);
  if ((((bVar1) ||
       (((bVar1 = is_trusted(in_RSI,0), bVar1 && (*(short *)&in_RSI->short_descr < 0x15)) &&
        (*(int *)&in_RSI->field_0x104 < 0x3e9)))) ||
      (((bVar1 = is_trusted(in_RSI,0), bVar1 && (*(short *)&in_RSI->short_descr < 0xb)) &&
       (*(int *)&in_RSI->field_0x104 < 0x1f5)))) ||
     ((((bVar1 = is_trusted(in_RSI,0), bVar1 && (*(short *)&in_RSI->short_descr < 6)) &&
       (*(int *)&in_RSI->field_0x104 < 0xfb)) ||
      (((bVar1 = is_trusted(in_RSI,0), bVar1 && (*(short *)&in_RSI->short_descr == 0)) &&
       (*(int *)&in_RSI->field_0x104 < 0x65)))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool obj_check(CHAR_DATA *ch, OBJ_DATA *obj)
{
	if (is_trusted(ch, GOD)
		|| (is_trusted(ch, IMMORTAL) && obj->level <= 20 && obj->cost <= 1000)
		|| (is_trusted(ch, DEMI) && obj->level <= 10 && obj->cost <= 500)
		|| (is_trusted(ch, ANGEL) && obj->level <= 5 && obj->cost <= 250)
		|| (is_trusted(ch, AVATAR) && obj->level == 0 && obj->cost <= 100))
		return true;
	else
		return false;
}